

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_read_corrupt_utf8(void)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  bson_error_t error;
  
  memset(&error,0,0x200);
  lVar2 = bson_new_from_json(anon_var_dwarf_154df,0xffffffffffffffff,&error);
  if (lVar2 != 0) {
    pcVar4 = "!bson_new_from_json ((uint8_t *) bad_key, -1, &error)";
    uVar5 = 0x41d;
LAB_0012225e:
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            uVar5,"test_bson_json_read_corrupt_utf8",pcVar4);
    abort();
  }
  uVar1 = error.domain;
  if ((error.domain != 1) || (uVar1 = error.code, error.code != 1)) {
    uVar5 = 0x421;
LAB_001222f9:
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)uVar1,"==",1,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            uVar5,"test_bson_json_read_corrupt_utf8");
    abort();
  }
  pcVar4 = error.message;
  pcVar3 = strstr(pcVar4,"invalid bytes in UTF8 string");
  if (pcVar3 != (char *)0x0) {
    lVar2 = bson_new_from_json(anon_var_dwarf_154eb,0xffffffffffffffff,&error);
    if (lVar2 != 0) {
      pcVar4 = "!bson_new_from_json ((uint8_t *) bad_value, -1, &error)";
      uVar5 = 0x423;
      goto LAB_0012225e;
    }
    if ((error.domain != 1) || (error.domain = error.code, error.code != 1)) {
      uVar5 = 0x427;
      uVar1 = error.domain;
      goto LAB_001222f9;
    }
    pcVar3 = strstr(pcVar4,"invalid bytes in UTF8 string");
    if (pcVar3 != (char *)0x0) {
      return;
    }
  }
  fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",pcVar4,
          "invalid bytes in UTF8 string");
  abort();
}

Assistant:

static void
test_bson_json_read_corrupt_utf8 (void)
{
   const char *bad_key = "{ \"\x80\" : \"a\"}";
   const char *bad_value = "{ \"a\" : \"\x80\"}";
   bson_error_t error = {0};

   BSON_ASSERT (!bson_new_from_json ((uint8_t *) bad_key, -1, &error));
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_CORRUPT_JS,
                          "invalid bytes in UTF8 string");

   BSON_ASSERT (!bson_new_from_json ((uint8_t *) bad_value, -1, &error));
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_CORRUPT_JS,
                          "invalid bytes in UTF8 string");
}